

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall FIX::double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  int iVar1;
  uint *puVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
      return;
    }
    if (this->used_digits_ < 1) {
      uVar5 = 0;
    }
    else {
      puVar2 = (this->bigits_).start_;
      lVar6 = 0;
      uVar5 = 0;
      do {
        if ((this->bigits_).length_ <= lVar6) goto LAB_00166643;
        uVar4 = (ulong)puVar2[lVar6];
        uVar7 = (ulong)((uint)uVar5 & 0xfffffff) + (factor & 0xffffffff) * uVar4;
        puVar2[lVar6] = (uint)uVar7 & 0xfffffff;
        uVar5 = uVar4 * (factor >> 0x1c & 0xfffffffffffffff0) + (uVar5 >> 0x1c) + (uVar7 >> 0x1c);
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->used_digits_);
    }
    if (uVar5 != 0) {
      puVar2 = (this->bigits_).start_;
      do {
        iVar1 = this->used_digits_;
        if (0x7f < (long)iVar1) {
          abort();
        }
        if ((iVar1 < 0) || ((this->bigits_).length_ <= iVar1)) {
LAB_00166643:
          __assert_fail("0 <= index && index < length_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                        ,0xca,
                        "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                       );
        }
        puVar2[iVar1] = (uint)uVar5 & 0xfffffff;
        this->used_digits_ = this->used_digits_ + 1;
        bVar3 = 0xfffffff < uVar5;
        uVar5 = uVar5 >> 0x1c;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(uint64_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  uint64_t low = factor & 0xFFFFFFFF;
  uint64_t high = factor >> 32;
  for (int i = 0; i < used_digits_; ++i) {
    uint64_t product_low = low * bigits_[i];
    uint64_t product_high = high * bigits_[i];
    uint64_t tmp = (carry & kBigitMask) + product_low;
    bigits_[i] = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}